

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectiveParser.cpp
# Opt level: O0

void __thiscall Refal2::CDirectiveParser::twoNamesAfterName(CDirectiveParser *this)

{
  long *plVar1;
  code *local_48;
  code *local_30;
  CDirectiveParser *this_local;
  
  if ((this->super_CRuleParser).super_CQualifierParser.token.type == TT_Comma) {
    local_30 = (code *)this->handler;
    plVar1 = (long *)((long)&(this->super_CRuleParser).super_CQualifierParser.super_CModuleBuilder.
                             super_CProgramBuilder.super_CFunctionBuilder.super_CVariablesBuilder.
                             super_CErrorsHelper + *(long *)&this->field_0x1ef0);
    if (((ulong)local_30 & 1) != 0) {
      local_30 = *(code **)(local_30 + *plVar1 + -1);
    }
    (*local_30)(plVar1);
    this->state = S_TwoNames;
  }
  else if ((this->super_CRuleParser).super_CQualifierParser.token.type == TT_LeftParen) {
    this->state = S_TwoNamesAfterLeftParen;
  }
  else if ((this->super_CRuleParser).super_CQualifierParser.token.type == TT_LineFeed) {
    local_48 = (code *)this->handler;
    plVar1 = (long *)((long)&(this->super_CRuleParser).super_CQualifierParser.super_CModuleBuilder.
                             super_CProgramBuilder.super_CFunctionBuilder.super_CVariablesBuilder.
                             super_CErrorsHelper + *(long *)&this->field_0x1ef0);
    if (((ulong)local_48 & 1) != 0) {
      local_48 = *(code **)(local_48 + *plVar1 + -1);
    }
    (*local_48)(plVar1);
    CParsingElementState::SetCorrect
              (&(this->super_CRuleParser).super_CQualifierParser.super_CParsingElementState);
  }
  else if ((this->super_CRuleParser).super_CQualifierParser.token.type != TT_Blank) {
    wrongDirectiveFormat(this);
  }
  return;
}

Assistant:

void CDirectiveParser::twoNamesAfterName()
{
	if( token.type == TT_Comma ) {
		( this->*handler )();
		state = S_TwoNames;
	} else if( token.type == TT_LeftParen ) {
		state = S_TwoNamesAfterLeftParen;
	} else if( token.type == TT_LineFeed ) {
		( this->*handler )();
		SetCorrect();
	} else if( token.type != TT_Blank ) {
		wrongDirectiveFormat();
	}
}